

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O0

int If_CutMerge(If_Man_t *p,If_Cut_t *pCut0,If_Cut_t *pCut1,If_Cut_t *pCut)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint local_64;
  int local_60;
  int c;
  int k;
  int i;
  int *pC;
  int *pC1;
  int *pC0;
  int nSize1;
  int nSize0;
  int nLutSize;
  If_Cut_t *pCut_local;
  If_Cut_t *pCut1_local;
  If_Cut_t *pCut0_local;
  If_Man_t *p_local;
  
  uVar1 = *(uint *)&pCut0->field_0x1c;
  uVar3 = *(uint *)&pCut0->field_0x1c >> 0x18;
  uVar2 = *(uint *)&pCut1->field_0x1c;
  c = 0;
  local_64 = uVar3;
  do {
    if ((int)(uVar2 >> 0x18) <= c) {
      for (c = 0; c < (int)uVar3; c = c + 1) {
        (&pCut[1].Area)[c] = (&pCut0[1].Area)[c];
      }
      *(uint *)&pCut->field_0x1c = *(uint *)&pCut->field_0x1c & 0xffffff | local_64 << 0x18;
      pCut->uSign = pCut0->uSign | pCut1->uSign;
      return 1;
    }
    for (local_60 = 0;
        (local_60 < (int)uVar3 && ((&pCut1[1].Area)[c] != (&pCut0[1].Area)[local_60]));
        local_60 = local_60 + 1) {
    }
    if (local_60 < (int)uVar3) {
      p->pPerm[1][c] = local_60;
    }
    else {
      if (local_64 == (uVar1 >> 0x10 & 0xff)) {
        return 0;
      }
      p->pPerm[1][c] = local_64;
      (&pCut[1].Area)[(int)local_64] = (&pCut1[1].Area)[c];
      local_64 = local_64 + 1;
    }
    c = c + 1;
  } while( true );
}

Assistant:

int If_CutMerge( If_Man_t * p, If_Cut_t * pCut0, If_Cut_t * pCut1, If_Cut_t * pCut )
{ 
    int nLutSize = pCut0->nLimit;
    int nSize0 = pCut0->nLeaves;
    int nSize1 = pCut1->nLeaves;
    int * pC0 = pCut0->pLeaves;
    int * pC1 = pCut1->pLeaves;
    int * pC = pCut->pLeaves;
    int i, k, c;
    // compare two cuts with different numbers
    c = nSize0; 
    for ( i = 0; i < nSize1; i++ )
    {
        for ( k = 0; k < nSize0; k++ )
            if ( pC1[i] == pC0[k] )
                break;
        if ( k < nSize0 )
        {
            p->pPerm[1][i] = k;
            continue;
        }
        if ( c == nLutSize )
            return 0;
        p->pPerm[1][i] = c;
        pC[c++] = pC1[i];
    }
    for ( i = 0; i < nSize0; i++ )
        pC[i] = pC0[i];
    pCut->nLeaves = c;
    pCut->uSign = pCut0->uSign | pCut1->uSign;
    return 1;
}